

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O0

void __thiscall gdscpp::push_back_STR(gdscpp *this,gdsSTR *target_structure)

{
  size_type sVar1;
  size_type sVar2;
  unsigned_long local_48;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_40;
  gdsSTR *local_18;
  gdsSTR *target_structure_local;
  gdscpp *this_local;
  
  local_18 = target_structure;
  target_structure_local = (gdsSTR *)this;
  sVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::count(&this->STR_Lookup,&target_structure->name);
  if (sVar1 == 0) {
    std::vector<gdsSTR,_std::allocator<gdsSTR>_>::push_back(&this->STR,target_structure);
    sVar2 = std::vector<gdsSTR,_std::allocator<gdsSTR>_>::size(&this->STR);
    local_48 = sVar2 - 1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_long,_true>
              (&local_40,&target_structure->name,&local_48);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::insert(&this->STR_Lookup,&local_40);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair(&local_40);
  }
  return;
}

Assistant:

void gdscpp::push_back_STR(gdsSTR target_structure)
{
  if (!STR_Lookup.count(target_structure.name)) // if doesn't already exist
  {
    STR.push_back(target_structure);
    STR_Lookup.insert({target_structure.name, (STR.size() - 1)});
  }
}